

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structured_mesh_demo.cc
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pbVar1;
  size_type sVar2;
  size_type sVar3;
  undefined8 mesh;
  options_description_easy_init *poVar4;
  typed_value<int,_char> *ptVar5;
  const_iterator cVar6;
  ostream *poVar7;
  variable_value *pvVar8;
  size_type *psVar9;
  StructuredMeshBuilder *pSVar10;
  int iVar11;
  shared_ptr<lf::mesh::Mesh> mesh_p;
  options_description desc;
  variables_map vm;
  __uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_1f0;
  undefined1 local_1e8 [64];
  undefined1 local_1a8 [16];
  string local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  options_description local_168;
  undefined1 local_e8 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  function1<std::pair<std::string,_std::string>,_const_std::string_&> local_48;
  
  local_e8._0_8_ = &local_d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e8,
             "LehrFEM++ demo: construction of tensor producy triangular mesh\nUse the option `-h` to display the control variables."
             ,"");
  boost::program_options::options_description::options_description
            (&local_168,(string *)local_e8,0x50,0x28);
  if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
       *)local_e8._0_8_ != &local_d8) {
    operator_delete((void *)local_e8._0_8_,local_d8._M_impl._0_8_ + 1);
  }
  local_e8._0_8_ = boost::program_options::options_description::add_options(&local_168);
  poVar4 = boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)local_e8,"help,h","Display help");
  ptVar5 = boost::program_options::value<int>((int *)0x0);
  ptVar5->m_required = true;
  poVar4 = boost::program_options::options_description_easy_init::operator()
                     (poVar4,"Nx_cells",(value_semantic *)ptVar5,
                      "No of cells in X direction, must be > 0");
  ptVar5 = boost::program_options::value<int>((int *)0x0);
  ptVar5->m_required = true;
  boost::program_options::options_description_easy_init::operator()
            (poVar4,"Ny_cells",(value_semantic *)ptVar5,"No of cells in Y direction, must be > 0");
  boost::program_options::variables_map::variables_map((variables_map *)local_e8);
  local_48.super_function_base.vtable = (vtable_base *)0x0;
  local_48.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_48.super_function_base.functor._8_8_ = 0;
  local_48.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_1e8,argc,argv,&local_168,0,&local_48);
  boost::program_options::store((parsed_options *)local_1e8,(variables_map *)local_e8,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_1e8);
  boost::
  function_n<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function_n(&local_48);
  boost::program_options::parse_config_file<char>
            ((basic_parsed_options<char> *)local_1e8,"setup.vars",&local_168,false);
  boost::program_options::store((parsed_options *)local_1e8,(variables_map *)local_e8,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_1e8);
  pbVar1 = (pointer)(local_1e8 + 0x10);
  local_1e8._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"help","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(&local_d8,(key_type *)local_1e8);
  if ((pointer)local_1e8._0_8_ != pbVar1) {
    operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
  }
  if ((_Rb_tree_header *)cVar6._M_node == &local_d8._M_impl.super__Rb_tree_header) {
    boost::program_options::notify((variables_map *)local_e8);
    local_1e8._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"Nx_cells","");
    pvVar8 = boost::program_options::abstract_variables_map::operator[]
                       ((abstract_variables_map *)local_e8,(string *)local_1e8);
    psVar9 = (size_type *)boost::any_cast<int_const&>(&pvVar8->v);
    sVar2 = *psVar9;
    if ((pointer)local_1e8._0_8_ != pbVar1) {
      operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
    }
    local_1e8._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"Ny_cells","");
    pvVar8 = boost::program_options::abstract_variables_map::operator[]
                       ((abstract_variables_map *)local_e8,(string *)local_1e8);
    psVar9 = (size_type *)boost::any_cast<int_const&>(&pvVar8->v);
    sVar3 = *psVar9;
    if ((pointer)local_1e8._0_8_ != pbVar1) {
      operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
    }
    if (sVar3 == 0 || sVar2 == 0) {
      iVar11 = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Nx and Ny must not be zero, set using options --Nx_cells and --Ny_cells\n",0x48);
    }
    else {
      local_1f0._M_t.
      super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
      super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl =
           (tuple<lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
           operator_new(0x60);
      *(undefined ***)
       local_1f0._M_t.
       super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
       super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl = &PTR_DimWorld_002a95b0;
      *(undefined4 *)
       ((long)local_1f0._M_t.
              super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
              .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 8) = 2;
      *(long *)((long)local_1f0._M_t.
                      super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                      .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x10) =
           0;
      *(long *)((long)local_1f0._M_t.
                      super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                      .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x18) =
           0;
      *(long *)((long)local_1f0._M_t.
                      super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                      .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x20) =
           0;
      *(long *)((long)local_1f0._M_t.
                      super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                      .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x28) =
           0;
      *(long *)((long)local_1f0._M_t.
                      super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                      .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x30) =
           0;
      *(long *)((long)local_1f0._M_t.
                      super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                      .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x38) =
           0;
      *(long *)((long)local_1f0._M_t.
                      super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                      .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x40) =
           0;
      *(long *)((long)local_1f0._M_t.
                      super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                      .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x48) =
           0;
      *(long *)((long)local_1f0._M_t.
                      super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                      .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x50) =
           0;
      *(undefined1 *)
       ((long)local_1f0._M_t.
              super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
              .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x58) = 1;
      lf::mesh::utils::TPTriagMeshBuilder::TPTriagMeshBuilder
                ((TPTriagMeshBuilder *)local_1e8,
                 (unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *)
                 &local_1f0);
      if ((_Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
          local_1f0._M_t.
          super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
          .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl != (MeshFactory *)0x0)
      {
        (**(code **)(*(long *)local_1f0._M_t.
                              super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                              .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl +
                    0x38))();
      }
      local_1f0._M_t.
      super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
      super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl =
           (tuple<lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
           (_Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
           0x0;
      local_1a8._0_8_ = (Mesh *)0x0;
      local_1a8._8_8_ =
           (__uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>)0x0;
      pSVar10 = lf::mesh::utils::StructuredMeshBuilder::
                setBottomLeftCorner<Eigen::Matrix<double,2,1,0,2,1>>
                          ((StructuredMeshBuilder *)local_1e8,
                           (Matrix<double,_2,_1,_0,_2,_1> *)local_1a8);
      local_178._M_allocated_capacity = 0x3ff0000000000000;
      local_178._8_8_ = 0x3ff0000000000000;
      pSVar10 = lf::mesh::utils::StructuredMeshBuilder::
                setTopRightCorner<Eigen::Matrix<double,2,1,0,2,1>>
                          (pSVar10,(Matrix<double,_2,_1,_0,_2,_1> *)&local_178);
      pSVar10->num_of_x_cells_ = sVar2;
      pSVar10->num_of_y_cells_ = sVar3;
      lf::mesh::utils::TPTriagMeshBuilder::Build((TPTriagMeshBuilder *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Checking entity indexing",0x18);
      local_178._M_local_buf[0] = '\n';
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_178._M_local_buf,1);
      lf::mesh::test_utils::checkEntityIndexing((Mesh *)local_1a8._0_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Checking mesh completeness",0x1a);
      local_178._M_local_buf[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_178._M_local_buf,1);
      lf::mesh::test_utils::checkMeshCompleteness((Mesh *)local_1a8._0_8_);
      lf::mesh::utils::PrintInfo((ostream *)&std::cout,(Mesh *)local_1a8._0_8_,0xb);
      mesh = local_1a8._0_8_;
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_1a8 + 0x10),"lf_tptriagmesh.m","");
      lf::io::writeMatlab((Mesh *)mesh,(string *)(local_1a8 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      if ((_Head_base<0UL,_lf::mesh::MeshFactory_*,_false>)local_1a8._8_8_ !=
          (_Head_base<0UL,_lf::mesh::MeshFactory_*,_false>)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
      }
      local_1e8._0_8_ = &PTR___cxa_pure_virtual_002a70c0;
      if ((MeshFactory *)local_1e8._8_8_ != (MeshFactory *)0x0) {
        (**(code **)(*(long *)local_1e8._8_8_ + 0x38))();
      }
      iVar11 = 0;
    }
  }
  else {
    poVar7 = boost::program_options::operator<<((ostream *)&std::cout,&local_168);
    local_1e8[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_1e8,1);
    iVar11 = 1;
  }
  local_e8._0_8_ = &PTR__variables_map_002a83f0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_78);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(&local_d8);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(&local_168.groups);
  if (local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage -
                    (long)local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(&local_168.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.m_caption._M_dataplus._M_p != &local_168.m_caption.field_2) {
    operator_delete(local_168.m_caption._M_dataplus._M_p,
                    local_168.m_caption.field_2._M_allocated_capacity + 1);
  }
  return iVar11;
}

Assistant:

int main(int argc, char** argv) {
  using size_type = lf::base::size_type;

  namespace po = boost::program_options;

  // clang-format off
  po::options_description desc("LehrFEM++ demo: construction of tensor producy triangular mesh\nUse the option `-h` to display the control variables.");
  desc.add_options()
    ("help,h", "Display help")
    ("Nx_cells", po::value<int>()->required(), "No of cells in X direction, must be > 0")
    ("Ny_cells", po::value<int>()->required(), "No of cells in Y direction, must be > 0")
  ;
  //clang-format on

  // Set control variables from command line or file "setup vars"
  // check for file with options
  po::variables_map vm;
  po::store(po::parse_command_line(argc, argv, desc), vm);
  try {
    po::store(po::parse_config_file<char>("setup.vars", desc), vm);
  } catch(const po::reading_file& error) {
    std::cout << "No file `setup.vars` specifying control variables\n";
  }

  if(vm.count("help") > 0) {
    std::cout << desc << '\n';
    return 1;
  }

  po::notify(vm);

  

  // number of cells cannot be 0, that would result in segfault!
  const int Nx = vm["Nx_cells"].as<int>();
  const int Ny = vm["Ny_cells"].as<int>();
  if (Nx == 0 || Ny == 0) {
    std::cout << "Nx and Ny must not be zero, set using options --Nx_cells and "
                 "--Ny_cells\n";
    return 0;
  }

  // Construct a triangular tensor product mesh with 2*Nx*Ny cells
  lf::mesh::utils::TPTriagMeshBuilder builder(
      std::make_unique<lf::mesh::hybrid2d::MeshFactory>(2));
  // Set mesh parameters following the Builder pattern
  // Domain is the unit square
  builder.setBottomLeftCorner(Eigen::Vector2d{0, 0})
      .setTopRightCorner(Eigen::Vector2d{1, 1})
      .setNumXCells(Nx)
      .setNumYCells(Ny);
  auto mesh_p = builder.Build();

  // Some consistency checks.
  // These should not be included in a regular code
  std::cout << "Checking entity indexing" << '\n';
  lf::mesh::test_utils::checkEntityIndexing(*mesh_p);
  std::cout << "Checking mesh completeness" << '\n';
  lf::mesh::test_utils::checkMeshCompleteness(*mesh_p);

  // Printing mesh information
  lf::mesh::utils::PrintInfo(std::cout, *mesh_p);

  // Matlab output of mesh
  lf::io::writeMatlab(*mesh_p, "lf_tptriagmesh.m");
  return 0;
}